

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_PostEffect_*>::Insert
          (ON_SimpleArray<ON_PostEffect_*> *this,int i,ON_PostEffect **x)

{
  uint uVar1;
  ON_PostEffect **memblock;
  uint uVar2;
  
  if (-1 < i) {
    uVar2 = this->m_count;
    if (i <= (int)uVar2) {
      memblock = x;
      if (uVar2 == this->m_capacity) {
        if (x < this->m_a + uVar2 && this->m_a <= x) {
          memblock = (ON_PostEffect **)onmalloc(8);
          *memblock = *x;
          uVar2 = this->m_count;
        }
        if (((int)uVar2 < 8) || ((ulong)((long)(int)uVar2 * 8) < 0x10000001)) {
          uVar1 = 4;
          if (2 < (int)uVar2) {
            uVar1 = uVar2 * 2;
          }
        }
        else {
          uVar1 = 0x2000008;
          if (uVar2 < 0x2000008) {
            uVar1 = uVar2;
          }
          uVar1 = uVar1 + uVar2;
        }
        if ((uint)this->m_capacity < uVar1) {
          SetCapacity(this,(long)(int)uVar1);
          uVar2 = this->m_count;
        }
      }
      this->m_count = uVar2 + 1;
      Move(this,i + 1,i,uVar2 - i);
      this->m_a[(uint)i] = *memblock;
      if (memblock != x) {
        onfree(memblock);
        return;
      }
    }
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Insert( int i, const T& x ) 
{
  if( i >= 0 && i <= m_count ) 
  {
    const T* p = &x;
    if ( m_count == m_capacity ) 
    {
      if (&x >= m_a && &x < (m_a + m_capacity))
      {
        // x is in the block of memory about to be reallocated.
        void* temp = onmalloc(sizeof(T));
        memcpy(temp, p, sizeof(T));
        p = (T*)temp;
      }
      int newcapacity = NewCapacity();
      Reserve( newcapacity );
    }
	  m_count++;
    Move( i+1, i, m_count-1-i );
	  m_a[i] = *p;
    if (p != &x)
      onfree((void*)p);
  }
}